

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_free(void *p)

{
  int iVar1;
  void *p_local;
  
  if (p != (void *)0x0) {
    if (sqlite3Config.bMemstat == 0) {
      (*sqlite3Config.m.xFree)(p);
    }
    else {
      sqlite3_mutex_enter(mem0.mutex);
      iVar1 = sqlite3MallocSize(p);
      sqlite3StatusAdd(0,-iVar1);
      sqlite3StatusAdd(9,-1);
      (*sqlite3Config.m.xFree)(p);
      sqlite3_mutex_leave(mem0.mutex);
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free(void *p){
  if( p==0 ) return;  /* IMP: R-49053-54554 */
  assert( sqlite3MemdebugNoType(p, MEMTYPE_DB) );
  assert( sqlite3MemdebugHasType(p, MEMTYPE_HEAP) );
  if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusAdd(SQLITE_STATUS_MEMORY_USED, -sqlite3MallocSize(p));
    sqlite3StatusAdd(SQLITE_STATUS_MALLOC_COUNT, -1);
    sqlite3GlobalConfig.m.xFree(p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3GlobalConfig.m.xFree(p);
  }
}